

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O2

int __thiscall ReadData::ReadHead(ReadData *this,FILE *file,uchar *buff)

{
  ushort uVar1;
  int iVar2;
  undefined8 in_RAX;
  size_t sVar3;
  ostream *poVar4;
  undefined5 uStack_38;
  uchar HeadFlag [3];
  
  if (file == (FILE *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"open error");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar2 = 7;
  }
  else {
    _uStack_38 = in_RAX;
    while (iVar2 = feof((FILE *)file), iVar2 == 0) {
      sVar3 = fread(HeadFlag + 2,1,1,(FILE *)file);
      if (sVar3 == 0) {
        return 2;
      }
      if (HeadFlag[2] == '\x12' && (HeadFlag[1] == 'D' && HeadFlag[0] == 0xaa)) {
        sVar3 = fread(buff,0x19,1,(FILE *)file);
        if (sVar3 == 0) {
          return 2;
        }
        uVar1 = *(ushort *)(buff + 1);
        (this->Head).MessageID = (uint)uVar1;
        (this->Head).MessageLength = (uint)*(ushort *)(buff + 5);
        (this->Head).TimeStatus = (uint)buff[10];
        if (uVar1 == 0x2b) {
          (this->Head).GPST.Week = (uint)*(ushort *)(buff + 0xb);
          (this->Head).GPST.SOW = (double)*(int *)(buff + 0xd) / 1000.0;
        }
        (this->Head).HealthFlag = *(uint *)(buff + 0x11) & 1;
        break;
      }
      _uStack_38 = CONCAT15(HeadFlag[1],uStack_38);
      _uStack_38 = CONCAT16(HeadFlag[2],_uStack_38);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ReadData::ReadHead(FILE* file, unsigned char* buff)
{
    if(file == NULL)
    {
        cout << "open error" << endl;
        return OPEN_ERROR;
    }

    unsigned char HeadFlag[3];
    while(!feof(file))
    {
        if(!fread(&HeadFlag[2], 1, 1, file))
            return FILE_OR_BUFF_END;

        if(HeadFlag[0] != 0xaa || HeadFlag[1] != 0x44 || HeadFlag[2] != 0x12)
        {
            HeadFlag[0] = HeadFlag[1];
            HeadFlag[1] = HeadFlag[2];
            continue;
        }
        if(!fread(buff, 25, 1, file))
            return FILE_OR_BUFF_END;
        int HeadLength = U2I((buff + 3), 1);
        try
        {
            this->Head.MessageID = U2I((buff + 1), 2);
            this->Head.MessageLength = U2I((buff + 5), 2);
            this->Head.TimeStatus = U2I((buff + 10), 1);
            if(this->Head.MessageID == 43)
            {
                this->Head.GPST.Week = U2I((buff + 11), 2);
                this->Head.GPST.SOW = U2I((buff + 13), 4) / 1000.0;
            }
            this->Head.HealthFlag = (U2I((buff + 17), 4) & 1);
        }
        catch(...)
        {
            cout << "error happened when reading head" << endl;
            return UNKNOWN_ERROR;
        }
        break;
    }
    
    return 0;
}